

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_backup_step(sqlite3_backup *p,int nPage)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Pgno PVar7;
  Pager *p_00;
  Pager *pPager;
  Pager *pPager_00;
  Btree *pBVar8;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  u8 *zData;
  Pgno iSrcPg_1;
  i64 iEnd;
  i64 iOff;
  Pgno iPg;
  sqlite3_file *pFile;
  i64 iSize;
  int ratio;
  int nDestTruncate;
  Pgno iSrcPg;
  int bCloseTrans;
  int nSrcPage;
  int ii;
  Pager *pDestPager;
  Pager *pSrcPager;
  int pgszDest;
  int pgszSrc;
  int destMode;
  int rc;
  PgHdr *pSrcPg_1;
  DbPage *pPg;
  int nDstPage;
  DbPage *pSrcPg;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  Btree *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  uint in_stack_ffffffffffffff38;
  Pgno in_stack_ffffffffffffff3c;
  long local_90;
  uint local_84;
  Pgno local_6c;
  int local_38;
  uint local_14;
  DbPage *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sqlite3_mutex_enter((sqlite3_mutex *)0x13b7bc);
  sqlite3BtreeEnter((Btree *)0x13b7cd);
  if (*in_RDI != 0) {
    sqlite3_mutex_enter((sqlite3_mutex *)0x13b7ef);
  }
  local_38 = (int)in_RDI[6];
  iVar2 = isFatalError(local_38);
  if (iVar2 == 0) {
    p_00 = sqlite3BtreePager((Btree *)in_RDI[5]);
    pPager = sqlite3BtreePager((Btree *)in_RDI[1]);
    iVar2 = 0;
    if ((*in_RDI == 0) || (*(char *)(*(long *)(in_RDI[5] + 8) + 0x24) != '\x02')) {
      local_38 = 0;
    }
    else {
      local_38 = 5;
    }
    if ((local_38 == 0) && (iVar3 = sqlite3BtreeTxnState((Btree *)in_RDI[5]), iVar3 == 0)) {
      local_38 = sqlite3BtreeBeginTrans
                           (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                            (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      iVar2 = 1;
    }
    if (((*(int *)((long)in_RDI + 0x14) == 0) && (local_38 == 0)) &&
       (iVar3 = setDestPgsz((sqlite3_backup *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)),
       iVar3 == 7)) {
      local_38 = 7;
    }
    if (((local_38 == 0) && (*(int *)((long)in_RDI + 0x14) == 0)) &&
       (local_38 = sqlite3BtreeBeginTrans
                             (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                              (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
       local_38 == 0)) {
      *(undefined4 *)((long)in_RDI + 0x14) = 1;
    }
    iVar3 = sqlite3BtreeGetPageSize((Btree *)in_RDI[5]);
    iVar4 = sqlite3BtreeGetPageSize((Btree *)in_RDI[1]);
    pPager_00 = sqlite3BtreePager((Btree *)in_RDI[1]);
    iVar5 = sqlite3PagerGetJournalMode(pPager_00);
    if (((local_38 == 0) && ((iVar5 == 5 || (iVar6 = sqlite3PagerIsMemdb(pPager), iVar6 != 0)))) &&
       (iVar3 != iVar4)) {
      local_38 = 8;
    }
    PVar7 = sqlite3BtreeLastPage((Btree *)0x13ba25);
    iVar6 = 0;
    while( true ) {
      if (((in_ESI < 0) || (bVar9 = false, iVar6 < in_ESI)) &&
         (bVar9 = false, *(uint *)(in_RDI + 3) <= PVar7)) {
        bVar9 = local_38 == 0;
      }
      if (!bVar9) break;
      if ((int)in_RDI[3] !=
          (uint)sqlite3PendingByte / *(uint *)(*(long *)(in_RDI[5] + 8) + 0x34) + 1) {
        local_10 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
        local_38 = sqlite3PagerGet((Pager *)CONCAT44(in_stack_ffffffffffffff34,
                                                     in_stack_ffffffffffffff30),
                                   (Pgno)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                                   (DbPage **)
                                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                   in_stack_ffffffffffffff1c);
        if (local_38 == 0) {
          sqlite3PagerGetData(local_10);
          local_38 = backupOnePage((sqlite3_backup *)p_00,(Pgno)((ulong)pPager >> 0x20),
                                   (u8 *)CONCAT44(iVar6,PVar7),iVar2);
          sqlite3PagerUnref((DbPage *)0x13bb68);
        }
      }
      *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
      iVar6 = iVar6 + 1;
    }
    if (local_38 == 0) {
      *(Pgno *)(in_RDI + 7) = PVar7;
      *(Pgno *)((long)in_RDI + 0x34) = (PVar7 + 1) - (int)in_RDI[3];
      if (PVar7 < *(uint *)(in_RDI + 3)) {
        local_38 = 0x65;
      }
      else if (*(int *)((long)in_RDI + 0x3c) == 0) {
        attachBackupObject((sqlite3_backup *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
    }
    if (local_38 == 0x65) {
      if (PVar7 == 0) {
        local_38 = sqlite3BtreeNewDb((Btree *)CONCAT44(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20));
        PVar7 = 1;
      }
      if ((local_38 == 0) || (local_38 == 0x65)) {
        local_38 = sqlite3BtreeUpdateMeta
                             ((Btree *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                              ,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                              (u32)in_stack_ffffffffffffff28);
      }
      if (local_38 == 0) {
        if (*in_RDI != 0) {
          sqlite3ResetAllSchemasOfConnection
                    ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        }
        if (iVar5 == 5) {
          local_38 = sqlite3BtreeSetVersion
                               ((Btree *)CONCAT44(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30),
                                (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
        }
      }
      if (local_38 == 0) {
        if (iVar3 < iVar4) {
          in_stack_ffffffffffffff3c = (int)(PVar7 + iVar4 / iVar3 + -1) / (iVar4 / iVar3);
          local_6c = in_stack_ffffffffffffff3c;
          if (in_stack_ffffffffffffff3c ==
              (uint)sqlite3PendingByte / *(uint *)(*(long *)(in_RDI[1] + 8) + 0x34) + 1) {
            local_6c = in_stack_ffffffffffffff3c - 1;
          }
        }
        else {
          local_6c = PVar7 * (iVar3 / iVar4);
          in_stack_ffffffffffffff38 = PVar7;
        }
        if (iVar3 < iVar4) {
          pBVar8 = (Btree *)((long)iVar3 * (long)(int)PVar7);
          sqlite3PagerFile(pPager);
          local_14 = 0xaaaaaaaa;
          sqlite3PagerPagecount(pPager,(int *)&local_14);
          local_84 = local_6c;
          while( true ) {
            uVar1 = in_stack_ffffffffffffff34 & 0xffffff;
            if (local_38 == 0) {
              uVar1 = CONCAT13(local_84 <= local_14,(int3)in_stack_ffffffffffffff34);
            }
            in_stack_ffffffffffffff34 = uVar1;
            PVar7 = (Pgno)((ulong)in_stack_ffffffffffffff28 >> 0x20);
            if ((char)(in_stack_ffffffffffffff34 >> 0x18) == '\0') break;
            in_stack_ffffffffffffff30 = local_84;
            if ((local_84 !=
                 (uint)sqlite3PendingByte / *(uint *)(*(long *)(in_RDI[1] + 8) + 0x34) + 1) &&
               (local_38 = sqlite3PagerGet((Pager *)CONCAT44(in_stack_ffffffffffffff34,local_84),
                                           PVar7,(DbPage **)
                                                 CONCAT44(in_stack_ffffffffffffff24,
                                                          in_stack_ffffffffffffff20),
                                           in_stack_ffffffffffffff1c), local_38 == 0)) {
              local_38 = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff1c,
                                                             in_stack_ffffffffffffff18));
              sqlite3PagerUnref((DbPage *)0x13bed7);
            }
            local_84 = local_84 + 1;
          }
          if (local_38 == 0) {
            local_38 = sqlite3PagerCommitPhaseOne
                                 ((Pager *)CONCAT44(in_stack_ffffffffffffff3c,
                                                    in_stack_ffffffffffffff38),
                                  (char *)CONCAT44(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30),PVar7);
          }
          if ((long)(sqlite3PendingByte + iVar4) < (long)pBVar8) {
            pBVar8 = (Btree *)(long)(sqlite3PendingByte + iVar4);
          }
          local_90 = (long)(sqlite3PendingByte + iVar3);
          in_stack_ffffffffffffff28 = pBVar8;
          while( true ) {
            uVar1 = in_stack_ffffffffffffff24 & 0xffffff;
            if (local_38 == 0) {
              uVar1 = CONCAT13(local_90 < (long)pBVar8,(int3)in_stack_ffffffffffffff24);
            }
            in_stack_ffffffffffffff24 = uVar1;
            if ((char)(in_stack_ffffffffffffff24 >> 0x18) == '\0') break;
            local_38 = sqlite3PagerGet((Pager *)CONCAT44(in_stack_ffffffffffffff34,
                                                         in_stack_ffffffffffffff30),
                                       (Pgno)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                                       (DbPage **)
                                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                                       ,in_stack_ffffffffffffff1c);
            if (local_38 == 0) {
              sqlite3PagerGetData((DbPage *)0x0);
              local_38 = sqlite3OsWrite((sqlite3_file *)
                                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff28,
                                        in_stack_ffffffffffffff24,
                                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18
                                                ));
            }
            sqlite3PagerUnref((DbPage *)0x13c027);
            local_90 = iVar3 + local_90;
          }
          if (local_38 == 0) {
            local_38 = backupTruncateFile((sqlite3_file *)
                                          CONCAT44(in_stack_ffffffffffffff24,
                                                   in_stack_ffffffffffffff20),
                                          CONCAT44(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18));
          }
          if (local_38 == 0) {
            local_38 = sqlite3PagerSync((Pager *)CONCAT44(in_stack_ffffffffffffff34,
                                                          in_stack_ffffffffffffff30),
                                        (char *)in_stack_ffffffffffffff28);
          }
        }
        else {
          sqlite3PagerTruncateImage(pPager,local_6c);
          local_38 = sqlite3PagerCommitPhaseOne
                               ((Pager *)CONCAT44(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38),
                                (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
        }
        if ((local_38 == 0) &&
           (local_38 = sqlite3BtreeCommitPhaseTwo
                                 (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24),
           local_38 == 0)) {
          local_38 = 0x65;
        }
      }
    }
    if (iVar2 != 0) {
      sqlite3BtreeCommitPhaseOne
                (in_stack_ffffffffffffff28,
                 (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      sqlite3BtreeCommitPhaseTwo(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    }
    if (local_38 == 0xc0a) {
      local_38 = 7;
    }
    *(int *)(in_RDI + 6) = local_38;
  }
  if (*in_RDI != 0) {
    sqlite3_mutex_leave((sqlite3_mutex *)0x13c167);
  }
  sqlite3BtreeLeave((Btree *)0x13c178);
  sqlite3_mutex_leave((sqlite3_mutex *)0x13c18d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

SQLITE_API int sqlite3_backup_step(sqlite3_backup *p, int nPage){
  int rc;
  int destMode;       /* Destination journal mode */
  int pgszSrc = 0;    /* Source page size */
  int pgszDest = 0;   /* Destination page size */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  rc = p->rc;
  if( !isFatalError(rc) ){
    Pager * const pSrcPager = sqlite3BtreePager(p->pSrc);     /* Source pager */
    Pager * const pDestPager = sqlite3BtreePager(p->pDest);   /* Dest pager */
    int ii;                            /* Iterator variable */
    int nSrcPage = -1;                 /* Size of source db in pages */
    int bCloseTrans = 0;               /* True if src db requires unlocking */

    /* If the source pager is currently in a write-transaction, return
    ** SQLITE_BUSY immediately.
    */
    if( p->pDestDb && p->pSrc->pBt->inTransaction==TRANS_WRITE ){
      rc = SQLITE_BUSY;
    }else{
      rc = SQLITE_OK;
    }

    /* If there is no open read-transaction on the source database, open
    ** one now. If a transaction is opened here, then it will be closed
    ** before this function exits.
    */
    if( rc==SQLITE_OK && SQLITE_TXN_NONE==sqlite3BtreeTxnState(p->pSrc) ){
      rc = sqlite3BtreeBeginTrans(p->pSrc, 0, 0);
      bCloseTrans = 1;
    }

    /* If the destination database has not yet been locked (i.e. if this
    ** is the first call to backup_step() for the current backup operation),
    ** try to set its page size to the same as the source database. This
    ** is especially important on ZipVFS systems, as in that case it is
    ** not possible to create a database file that uses one page size by
    ** writing to it with another.  */
    if( p->bDestLocked==0 && rc==SQLITE_OK && setDestPgsz(p)==SQLITE_NOMEM ){
      rc = SQLITE_NOMEM;
    }

    /* Lock the destination database, if it is not locked already. */
    if( SQLITE_OK==rc && p->bDestLocked==0
     && SQLITE_OK==(rc = sqlite3BtreeBeginTrans(p->pDest, 2,
                                                (int*)&p->iDestSchema))
    ){
      p->bDestLocked = 1;
    }

    /* Do not allow backup if the destination database is in WAL mode
    ** and the page sizes are different between source and destination */
    pgszSrc = sqlite3BtreeGetPageSize(p->pSrc);
    pgszDest = sqlite3BtreeGetPageSize(p->pDest);
    destMode = sqlite3PagerGetJournalMode(sqlite3BtreePager(p->pDest));
    if( SQLITE_OK==rc
     && (destMode==PAGER_JOURNALMODE_WAL || sqlite3PagerIsMemdb(pDestPager))
     && pgszSrc!=pgszDest
    ){
      rc = SQLITE_READONLY;
    }

    /* Now that there is a read-lock on the source database, query the
    ** source pager for the number of pages in the database.
    */
    nSrcPage = (int)sqlite3BtreeLastPage(p->pSrc);
    assert( nSrcPage>=0 );
    for(ii=0; (nPage<0 || ii<nPage) && p->iNext<=(Pgno)nSrcPage && !rc; ii++){
      const Pgno iSrcPg = p->iNext;                 /* Source page number */
      if( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) ){
        DbPage *pSrcPg;                             /* Source page object */
        rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg,PAGER_GET_READONLY);
        if( rc==SQLITE_OK ){
          rc = backupOnePage(p, iSrcPg, sqlite3PagerGetData(pSrcPg), 0);
          sqlite3PagerUnref(pSrcPg);
        }
      }
      p->iNext++;
    }
    if( rc==SQLITE_OK ){
      p->nPagecount = nSrcPage;
      p->nRemaining = nSrcPage+1-p->iNext;
      if( p->iNext>(Pgno)nSrcPage ){
        rc = SQLITE_DONE;
      }else if( !p->isAttached ){
        attachBackupObject(p);
      }
    }

    /* Update the schema version field in the destination database. This
    ** is to make sure that the schema-version really does change in
    ** the case where the source and destination databases have the
    ** same schema version.
    */
    if( rc==SQLITE_DONE ){
      if( nSrcPage==0 ){
        rc = sqlite3BtreeNewDb(p->pDest);
        nSrcPage = 1;
      }
      if( rc==SQLITE_OK || rc==SQLITE_DONE ){
        rc = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema+1);
      }
      if( rc==SQLITE_OK ){
        if( p->pDestDb ){
          sqlite3ResetAllSchemasOfConnection(p->pDestDb);
        }
        if( destMode==PAGER_JOURNALMODE_WAL ){
          rc = sqlite3BtreeSetVersion(p->pDest, 2);
        }
      }
      if( rc==SQLITE_OK ){
        int nDestTruncate;
        /* Set nDestTruncate to the final number of pages in the destination
        ** database. The complication here is that the destination page
        ** size may be different to the source page size.
        **
        ** If the source page size is smaller than the destination page size,
        ** round up. In this case the call to sqlite3OsTruncate() below will
        ** fix the size of the file. However it is important to call
        ** sqlite3PagerTruncateImage() here so that any pages in the
        ** destination file that lie beyond the nDestTruncate page mark are
        ** journalled by PagerCommitPhaseOne() before they are destroyed
        ** by the file truncation.
        */
        assert( pgszSrc==sqlite3BtreeGetPageSize(p->pSrc) );
        assert( pgszDest==sqlite3BtreeGetPageSize(p->pDest) );
        if( pgszSrc<pgszDest ){
          int ratio = pgszDest/pgszSrc;
          nDestTruncate = (nSrcPage+ratio-1)/ratio;
          if( nDestTruncate==(int)PENDING_BYTE_PAGE(p->pDest->pBt) ){
            nDestTruncate--;
          }
        }else{
          nDestTruncate = nSrcPage * (pgszSrc/pgszDest);
        }
        assert( nDestTruncate>0 );

        if( pgszSrc<pgszDest ){
          /* If the source page-size is smaller than the destination page-size,
          ** two extra things may need to happen:
          **
          **   * The destination may need to be truncated, and
          **
          **   * Data stored on the pages immediately following the
          **     pending-byte page in the source database may need to be
          **     copied into the destination database.
          */
          const i64 iSize = (i64)pgszSrc * (i64)nSrcPage;
          sqlite3_file * const pFile = sqlite3PagerFile(pDestPager);
          Pgno iPg;
          int nDstPage;
          i64 iOff;
          i64 iEnd;

          assert( pFile );
          assert( nDestTruncate==0
              || (i64)nDestTruncate*(i64)pgszDest >= iSize || (
                nDestTruncate==(int)(PENDING_BYTE_PAGE(p->pDest->pBt)-1)
             && iSize>=PENDING_BYTE && iSize<=PENDING_BYTE+pgszDest
          ));

          /* This block ensures that all data required to recreate the original
          ** database has been stored in the journal for pDestPager and the
          ** journal synced to disk. So at this point we may safely modify
          ** the database file in any way, knowing that if a power failure
          ** occurs, the original database will be reconstructed from the
          ** journal file.  */
          sqlite3PagerPagecount(pDestPager, &nDstPage);
          for(iPg=nDestTruncate; rc==SQLITE_OK && iPg<=(Pgno)nDstPage; iPg++){
            if( iPg!=PENDING_BYTE_PAGE(p->pDest->pBt) ){
              DbPage *pPg;
              rc = sqlite3PagerGet(pDestPager, iPg, &pPg, 0);
              if( rc==SQLITE_OK ){
                rc = sqlite3PagerWrite(pPg);
                sqlite3PagerUnref(pPg);
              }
            }
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 1);
          }

          /* Write the extra pages and truncate the database file as required */
          iEnd = MIN(PENDING_BYTE + pgszDest, iSize);
          for(
            iOff=PENDING_BYTE+pgszSrc;
            rc==SQLITE_OK && iOff<iEnd;
            iOff+=pgszSrc
          ){
            PgHdr *pSrcPg = 0;
            const Pgno iSrcPg = (Pgno)((iOff/pgszSrc)+1);
            rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg, 0);
            if( rc==SQLITE_OK ){
              u8 *zData = sqlite3PagerGetData(pSrcPg);
              rc = sqlite3OsWrite(pFile, zData, pgszSrc, iOff);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if( rc==SQLITE_OK ){
            rc = backupTruncateFile(pFile, iSize);
          }

          /* Sync the database file to disk. */
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerSync(pDestPager, 0);
          }
        }else{
          sqlite3PagerTruncateImage(pDestPager, nDestTruncate);
          rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 0);
        }

        /* Finish committing the transaction to the destination database. */
        if( SQLITE_OK==rc
         && SQLITE_OK==(rc = sqlite3BtreeCommitPhaseTwo(p->pDest, 0))
        ){
          rc = SQLITE_DONE;
        }
      }
    }

    /* If bCloseTrans is true, then this function opened a read transaction
    ** on the source database. Close the read transaction here. There is
    ** no need to check the return values of the btree methods here, as
    ** "committing" a read-only transaction cannot fail.
    */
    if( bCloseTrans ){
      TESTONLY( int rc2 );
      TESTONLY( rc2  = ) sqlite3BtreeCommitPhaseOne(p->pSrc, 0);
      TESTONLY( rc2 |= ) sqlite3BtreeCommitPhaseTwo(p->pSrc, 0);
      assert( rc2==SQLITE_OK );
    }

    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    p->rc = rc;
  }
  if( p->pDestDb ){
    sqlite3_mutex_leave(p->pDestDb->mutex);
  }
  sqlite3BtreeLeave(p->pSrc);
  sqlite3_mutex_leave(p->pSrcDb->mutex);
  return rc;
}